

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O2

void __thiscall EmmyFacade::Destroy(EmmyFacade *this)

{
  element_type *peVar1;
  __shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  OnDisconnect(this);
  peVar1 = (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_Transporter[2])();
    local_18._M_ptr = (element_type *)0x0;
    local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>,
               &local_18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  }
  return;
}

Assistant:

void EmmyFacade::Destroy() {
	OnDisconnect();

	if (transporter) {
		transporter->Stop();
		transporter = nullptr;
	}
}